

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  uv__queue **handle;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 *puVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ssize_t sVar9;
  long lVar10;
  sockaddr_storage peer;
  mmsghdr msgs [20];
  iovec iov [20];
  sockaddr_in6 peers [20];
  uv_buf_t local_988;
  uint local_978;
  int local_974;
  uv_buf_t local_970;
  msghdr local_960;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  mmsghdr local_8a8 [20];
  long local_3a8 [40];
  undefined1 local_268 [568];
  
  if (*(int *)&w[-2].watcher_queue.prev != 0xf) {
    __assert_fail("handle->type == UV_UDP",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                  ,0x8b,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  handle = &w[-2].pending_queue.prev;
  if ((revents & 1) == 0) {
LAB_0011a6ca:
    if (((revents & 4) != 0) && (((ulong)w[-1].pending_queue.prev & 3) == 0)) {
      uv__udp_sendmsg((uv_udp_t *)handle);
      uv__udp_run_completed((uv_udp_t *)handle);
    }
    return;
  }
  if (*(long *)&w[-1].fd == 0) {
    __assert_fail("handle->recv_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                  ,0xdc,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  lVar8._0_4_ = w[-1].pevents;
  lVar8._4_4_ = w[-1].events;
  local_978 = revents;
  if (lVar8 == 0) {
    __assert_fail("handle->alloc_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                  ,0xdd,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  iVar6 = 0x20;
LAB_0011a392:
  local_988 = uv_buf_init((char *)0x0,0);
  (**(code **)&w[-1].pevents)(handle,0x10000,&local_988);
  if ((local_988.base != (char *)0x0) && (local_988.len != 0)) {
    if (((ulong)w[-1].pending_queue.prev & 0x4000000) != 0) {
      uVar7 = local_988.len >> 0x10;
      if (0x13 < uVar7) {
        uVar7 = 0x14;
      }
      local_974 = iVar6;
      if (0xffff < local_988.len) {
        puVar5 = local_268;
        lVar8 = 0;
        pcVar4 = local_988.base;
        do {
          *(long *)((long)local_3a8 + lVar8) = (long)pcVar4;
          *(undefined8 *)((long)local_3a8 + lVar8 + 8) = 0x10000;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iov + lVar8 * 4) = 0;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iovlen + lVar8 * 4) = 0;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_name + lVar8 * 4) = 0;
          *(undefined8 *)(&local_8a8[0].msg_hdr.msg_namelen + lVar8) = 0;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_control + lVar8 * 4) = 0;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_controllen + lVar8 * 4) = 0;
          *(undefined8 *)(&local_8a8[0].msg_hdr.msg_flags + lVar8) = 0;
          *(long **)((long)&local_8a8[0].msg_hdr.msg_iov + lVar8 * 4) =
               (long *)((long)local_3a8 + lVar8);
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iovlen + lVar8 * 4) = 1;
          *(undefined1 **)((long)&local_8a8[0].msg_hdr.msg_name + lVar8 * 4) = puVar5;
          (&local_8a8[0].msg_hdr.msg_namelen)[lVar8] = 0x1c;
          (&local_8a8[0].msg_hdr.msg_flags)[lVar8] = 0;
          lVar8 = lVar8 + 0x10;
          puVar5 = puVar5 + 0x1c;
          pcVar4 = pcVar4 + 0x10000;
        } while (uVar7 << 4 != lVar8);
      }
      do {
        iVar6 = recvmmsg(w->fd,local_8a8,(uint)uVar7,0,(timespec *)0x0);
        if (iVar6 != -1) {
          if (0 < iVar6) {
            lVar10 = (long)iVar6;
            lVar8 = 0;
            goto LAB_0011a58b;
          }
          if (iVar6 == 0) goto LAB_0011a571;
          piVar3 = __errno_location();
          iVar1 = *piVar3;
          break;
        }
        piVar3 = __errno_location();
        iVar1 = *piVar3;
      } while (iVar1 == 4);
      if (iVar1 == 0xb) {
LAB_0011a571:
        lVar8 = 0;
      }
      else {
        lVar8 = (long)-iVar1;
      }
      (**(code **)&w[-1].fd)(handle,lVar8,&local_988);
      goto LAB_0011a65c;
    }
    local_960.msg_controllen = 0;
    local_960.msg_flags = 0;
    local_960._52_4_ = 0;
    local_960.msg_control = (void *)0x0;
    local_8b8 = 0;
    uStack_8b0 = 0;
    local_8c8 = 0;
    uStack_8c0 = 0;
    local_8d8 = 0;
    uStack_8d0 = 0;
    local_8e8 = 0;
    uStack_8e0 = 0;
    local_8f8 = 0;
    uStack_8f0 = 0;
    local_908 = 0;
    uStack_900 = 0;
    local_918 = 0;
    uStack_910 = 0;
    local_928 = 0;
    uStack_920 = 0;
    local_960.msg_name = &local_928;
    local_960.msg_namelen = 0x80;
    local_960._12_4_ = 0;
    local_960.msg_iovlen = 1;
    local_960.msg_iov = (iovec *)&local_988;
    do {
      sVar2 = recvmsg(w->fd,&local_960,0);
      sVar9 = sVar2;
      if (sVar2 != -1) goto LAB_0011a63e;
      piVar3 = __errno_location();
      iVar1 = *piVar3;
    } while ((long)iVar1 == 4);
    if (iVar1 == 0xb) {
      sVar9 = 0;
    }
    else {
      sVar9 = -(long)iVar1;
    }
LAB_0011a63e:
    (**(code **)&w[-1].fd)(handle,sVar9,&local_988);
    iVar6 = iVar6 + -1;
    goto LAB_0011a67c;
  }
  (**(code **)&w[-1].fd)(handle,0xffffffffffffff97,&local_988,0,0);
  revents = local_978;
  goto LAB_0011a6ca;
  while( true ) {
    local_970 = uv_buf_init(*(char **)((long)local_3a8 + lVar8),
                            *(size_t *)((long)local_3a8 + lVar8 + 8));
    (**(code **)&w[-1].fd)(handle,(&local_8a8[0].msg_len)[lVar8],&local_970);
    lVar8 = lVar8 + 0x10;
    lVar10 = lVar10 + -1;
    if (lVar10 == 0) break;
LAB_0011a58b:
    if (*(long *)&w[-1].fd == 0) goto LAB_0011a65c;
  }
  if (*(code **)&w[-1].fd != (code *)0x0) {
    (**(code **)&w[-1].fd)(handle,0,&local_988);
  }
LAB_0011a65c:
  sVar2 = (ssize_t)iVar6;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  iVar6 = local_974 - iVar6;
LAB_0011a67c:
  revents = local_978;
  if ((((sVar2 == -1) || (iVar6 < 1)) || (w->fd == -1)) || (*(long *)&w[-1].fd == 0))
  goto LAB_0011a6ca;
  goto LAB_0011a392;
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT && !uv__is_closing(handle)) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}